

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

void __thiscall
GlobOptBlockData::NullOutBlockData(GlobOptBlockData *this,GlobOpt *globOpt,Func *func)

{
  this->globOpt = globOpt;
  this->callSequence = (SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  this->stackLiteralInitFldDataMap = (StackLiteralInitFldDataMap *)0x0;
  this->inlinedArgOutSize = 0;
  this->hasCSECandidates = false;
  this->symToValueMap = (GlobHashTable *)0x0;
  this->exprToValueMap = (ExprHashTable *)0x0;
  this->liveFields = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->maybeWrittenTypeSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->isTempSrc = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->liveVarSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->liveInt32Syms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->liveLossyInt32Syms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->liveFloat64Syms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->argObjSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->maybeTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->canStoreTempObjectSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  this->valuesToKillOnCalls = (ValueSet *)0x0;
  this->inductionVariables = (InductionVariableSet *)0x0;
  this->availableIntBoundChecks = (IntBoundCheckSet *)0x0;
  this->startCallCount = 0;
  this->argOutCount = 0;
  this->totalOutParamCount = 0;
  this->curFunc = func;
  if (this->capturedValues != (CapturedValues *)0x0) {
    CapturedValues::DecrementRefCount(this->capturedValues);
  }
  this->hasDataRef = (bool *)0x0;
  this->capturedValues = (CapturedValues *)0x0;
  this->changedSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  return;
}

Assistant:

void
GlobOptBlockData::NullOutBlockData(GlobOpt* globOpt, Func* func)
{
    this->globOpt = globOpt;

    this->symToValueMap = nullptr;
    this->exprToValueMap = nullptr;
    this->liveFields = nullptr;
    this->maybeWrittenTypeSyms = nullptr;
    this->isTempSrc = nullptr;
    this->liveVarSyms = nullptr;
    this->liveInt32Syms = nullptr;
    this->liveLossyInt32Syms = nullptr;
    this->liveFloat64Syms = nullptr;
    this->argObjSyms = nullptr;
    this->maybeTempObjectSyms = nullptr;
    this->canStoreTempObjectSyms = nullptr;
    this->valuesToKillOnCalls = nullptr;
    this->inductionVariables = nullptr;
    this->availableIntBoundChecks = nullptr;
    this->callSequence = nullptr;
    this->startCallCount = 0;
    this->argOutCount = 0;
    this->totalOutParamCount = 0;
    this->inlinedArgOutSize = 0;
    this->hasCSECandidates = false;
    this->curFunc = func;

    this->stackLiteralInitFldDataMap = nullptr;

    if (this->capturedValues)
    {
        this->capturedValues->DecrementRefCount();
    }
    this->capturedValues = nullptr;
    this->changedSyms = nullptr;

    this->OnDataUnreferenced();
}